

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.c
# Opt level: O3

int rsa_sign_wrap(void *ctx,mbedtls_md_type_t md_alg,uchar *hash,size_t hash_len,uchar *sig,
                 size_t *sig_len,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  size_t sVar2;
  
  if (md_alg == MBEDTLS_MD_NONE && hash_len >> 0x20 != 0) {
    iVar1 = -16000;
  }
  else {
    sVar2 = mbedtls_rsa_get_len((mbedtls_rsa_context *)ctx);
    *sig_len = sVar2;
    iVar1 = mbedtls_rsa_pkcs1_sign
                      ((mbedtls_rsa_context *)ctx,f_rng,p_rng,1,md_alg,(uint)hash_len,hash,sig);
  }
  return iVar1;
}

Assistant:

static int rsa_sign_wrap( void *ctx, mbedtls_md_type_t md_alg,
                   const unsigned char *hash, size_t hash_len,
                   unsigned char *sig, size_t *sig_len,
                   int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    mbedtls_rsa_context * rsa = (mbedtls_rsa_context *) ctx;

#if SIZE_MAX > UINT_MAX
    if( md_alg == MBEDTLS_MD_NONE && UINT_MAX < hash_len )
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );
#endif /* SIZE_MAX > UINT_MAX */

    *sig_len = mbedtls_rsa_get_len( rsa );

    return( mbedtls_rsa_pkcs1_sign( rsa, f_rng, p_rng, MBEDTLS_RSA_PRIVATE,
                md_alg, (unsigned int) hash_len, hash, sig ) );
}